

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-type.c
# Opt level: O2

coda_cdf_time * time_type_new(int32_t data_type,coda_cdf_type *base_type)

{
  int iVar1;
  coda_cdf_time *type;
  coda_type_special *type_00;
  char *exprstring;
  coda_expression *expr;
  
  if ((data_type != 0x1f) && (data_type != 0x21)) {
    __assert_fail("data_type == 31 || data_type == 33",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                  ,0xd3,"coda_cdf_time *time_type_new(int32_t, coda_cdf_type *)");
  }
  type = (coda_cdf_time *)malloc(0x28);
  if (type == (coda_cdf_time *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x28,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                   ,0xd9);
  }
  else {
    type->definition = (coda_type_special *)0x0;
    type->base_type = (coda_dynamic_type *)0x0;
    type->backend = coda_backend_cdf;
    type->tag = tag_cdf_time;
    type->data_type = data_type;
    exprstring = "float(.) * 1e-9 - 43200.0";
    if (data_type == 0x1f) {
      exprstring = "float(.) * 1e-3 - 63113904000.0";
    }
    iVar1 = coda_expression_from_string(exprstring,&expr);
    if (iVar1 == 0) {
      type_00 = coda_type_time_new(coda_format_cdf,expr);
      type->definition = type_00;
      if (type_00 == (coda_type_special *)0x0) {
        coda_expression_delete(expr);
      }
      else {
        iVar1 = coda_type_time_set_base_type(type_00,base_type->definition);
        if (iVar1 == 0) {
          type->base_type = (coda_dynamic_type *)base_type;
          return type;
        }
      }
    }
    coda_cdf_type_delete((coda_dynamic_type *)type);
  }
  return (coda_cdf_time *)0x0;
}

Assistant:

static coda_cdf_time *time_type_new(int32_t data_type, coda_cdf_type *base_type)
{
    char *exprstr;
    coda_cdf_time *type;
    coda_expression *expr;

    assert(data_type == 31 || data_type == 33);

    type = (coda_cdf_time *)malloc(sizeof(coda_cdf_time));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_cdf_time), __FILE__, __LINE__);
        return NULL;
    }
    type->backend = coda_backend_cdf;
    type->definition = NULL;
    type->tag = tag_cdf_time;
    type->data_type = data_type;
    type->base_type = NULL;

    if (data_type == 31)
    {
        /* CDF_EPOCH */
        exprstr = "float(.) * 1e-3 - 63113904000.0";
    }
    else
    {
        /* CDF_TIME_TT2000 */
        exprstr = "float(.) * 1e-9 - 43200.0";
    }
    if (coda_expression_from_string(exprstr, &expr) != 0)
    {
        coda_cdf_type_delete((coda_dynamic_type *)type);
        return NULL;
    }
    type->definition = coda_type_time_new(coda_format_cdf, expr);
    if (type->definition == NULL)
    {
        coda_expression_delete(expr);
        coda_cdf_type_delete((coda_dynamic_type *)type);
        return NULL;
    }
    if (coda_type_time_set_base_type(type->definition, base_type->definition) != 0)
    {
        coda_cdf_type_delete((coda_dynamic_type *)type);
        return NULL;
    }
    type->base_type = (coda_dynamic_type *)base_type;

    return type;
}